

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref * __thiscall cashew::Value::operator[](Value *this,IString x)

{
  mapped_type *pmVar1;
  undefined1 local_18 [8];
  IString x_local;
  
  x_local.str._M_len = (size_t)x.str._M_str;
  local_18 = (undefined1  [8])x.str._M_len;
  if (this->type == Object) {
    pmVar1 = std::__detail::
             _Map_base<wasm::IString,_std::pair<const_wasm::IString,_cashew::Ref>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::IString,_std::pair<const_wasm::IString,_cashew::Ref>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)(this->field_1).arr,(key_type *)local_18);
    return pmVar1;
  }
  __assert_fail("isObject()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x1fb,"Ref &cashew::Value::operator[](IString)");
}

Assistant:

Ref& operator[](IString x) {
    assert(isObject());
    return (*obj)[x];
  }